

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excp_helper.c
# Opt level: O3

hwaddr get_hphys(CPUState *cs,hwaddr gphys,MMUAccessType access_type,int *prot)

{
  hwaddr addr;
  uint uVar1;
  uint32_t uVar2;
  int iVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  ulong uVar6;
  uint32_t uVar7;
  uint64_t uVar8;
  ulong uVar9;
  ulong local_48;
  ulong local_40;
  
  if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x80c) & 0x40) == 0) {
    return gphys;
  }
  uVar1 = *(uint *)(cs[1].tb_jmp_cache + 0x39d);
  if ((uVar1 & 1) == 0) {
    addr = ((ulong)cs[1].tb_jmp_cache[0x39c] & 0xfffffffffffff000) + (gphys >> 0x16 & 0x3ff) * 4;
    uVar2 = x86_ldl_phys_x86_64(cs,addr);
    if ((uVar2 & 1) == 0) goto LAB_005080b2;
    if ((-1 < (char)uVar2) || (((ulong)cs[1].tb_jmp_cache[0x124] & 0x10) == 0)) {
      local_48 = 4;
      uVar7 = uVar2;
      if ((uVar2 & 0x20) == 0) {
        uVar7 = uVar2 | 0x20;
        x86_stl_phys_notdirty_x86_64(cs,addr,uVar7);
      }
      uVar7 = x86_ldl_phys_x86_64(cs,(ulong)((uint)(gphys >> 10) & 0xffc | uVar7 & 0xfffff000));
      uVar8 = (uint64_t)uVar7;
      if ((uVar7 & 1) != 0) {
        local_40 = (ulong)(uVar2 & uVar7) | 0x8000000000000000;
        iVar3 = 0x1000;
        uVar6 = 0;
LAB_00508028:
        uVar6 = iVar3 - 1U & 0x7fffe000 | uVar6;
        goto LAB_00508034;
      }
      goto LAB_005080c2;
    }
    uVar8 = (ulong)(uVar2 & 0x1fe000) << 0x13 | (ulong)uVar2;
    local_40 = (ulong)uVar2 | 0x8000000000000000;
    uVar6 = 0x200000;
    iVar3 = 0x400000;
LAB_00508034:
    if ((uVar6 & uVar8) != 0) goto LAB_005080ab;
    if ((local_40 & 4) == 0) {
      local_48 = 5;
      goto LAB_005080c2;
    }
    if (-1 < (long)local_40) {
      if (access_type == MMU_INST_FETCH) {
        x86_stq_phys_x86_64(cs,(hwaddr)(cs[1].tb_jmp_cache[0x397]->jmp_list_next + 1),gphys);
        local_48 = 5;
        goto LAB_00508103;
      }
      *(byte *)prot = (byte)*prot & 0xfb;
    }
    if ((local_40 & 2) != 0) {
LAB_00508064:
      return (ulong)((uint)gphys & iVar3 - 1U) + (uVar8 & 0xffffffffff000 & (long)-iVar3);
    }
    if (access_type != MMU_DATA_STORE) {
      *(byte *)prot = (byte)*prot & 0xfd;
      goto LAB_00508064;
    }
    x86_stq_phys_x86_64(cs,(hwaddr)(cs[1].tb_jmp_cache[0x397]->jmp_list_next + 1),gphys);
    local_48 = 5;
LAB_00508129:
    uVar6 = 2;
  }
  else {
    uVar6 = ((ulong)(uVar1 >> 2) << 0x3f) + 0x800fff0000000000;
    if ((uVar1 & 2) == 0) {
      uVar8 = x86_ldq_phys_x86_64(cs,((ulong)cs[1].tb_jmp_cache[0x39c] & 0xffffffffffffffe0) +
                                     (gphys >> 0x1e & 3) * 8);
      if ((uVar8 & 1) != 0) {
        if (uVar8 >> 0x28 == 0) {
          uVar6 = uVar6 | 0x7ff0000000000000;
          local_40 = 0x8000000000000006;
LAB_00507f31:
          uVar9 = (ulong)((uint)(gphys >> 0x12) & 0xff8) | uVar8 & 0xffffffffff000;
          uVar8 = x86_ldq_phys_x86_64(cs,uVar9);
          if ((uVar8 & 1) == 0) goto LAB_005080b2;
          if ((uVar8 & uVar6) == 0) {
            local_40 = (uVar8 ^ 0x8000000000000000) & local_40;
            iVar3 = 0x200000;
            if (-1 < (char)uVar8) {
              local_48 = 4;
              if ((uVar8 & 0x20) == 0) {
                x86_stl_phys_notdirty_x86_64(cs,uVar9,(uint)uVar8 | 0x20);
              }
              uVar8 = x86_ldq_phys_x86_64(cs,(ulong)((uint)(gphys >> 9) & 0xff8) |
                                             uVar8 & 0xffffffffff000);
              if (((uVar8 & 1) == 0) || (local_48 = 0xd, (uVar8 & uVar6) != 0)) goto LAB_005080c2;
              local_40 = local_40 & (uVar8 ^ 0x8000000000000000);
              iVar3 = 0x1000;
            }
            goto LAB_00508028;
          }
        }
LAB_005080ab:
        local_48 = 0xd;
        goto LAB_005080c2;
      }
    }
    else {
      uVar9 = (ulong)((uint)(gphys >> 0x24) & 0xff8) |
              (ulong)cs[1].tb_jmp_cache[0x39c] & 0xffffffffff000;
      uVar4 = x86_ldq_phys_x86_64(cs,uVar9);
      if ((uVar4 & 1) != 0) {
        if ((uVar4 & (uVar6 | 0x80)) == 0) {
          local_48 = 4;
          if ((uVar4 & 0x20) == 0) {
            uVar4 = uVar4 | 0x20;
            x86_stl_phys_notdirty_x86_64(cs,uVar9,(uint32_t)uVar4);
          }
          uVar9 = (ulong)((uint)(gphys >> 0x1b) & 0xff8) | uVar4 & 0xffffffffff000;
          uVar5 = x86_ldq_phys_x86_64(cs,uVar9);
          if (((uVar5 & 1) == 0) || (local_48 = 0xd, (uVar5 & uVar6) != 0)) goto LAB_005080c2;
          uVar8 = uVar5;
          if ((uVar5 & 0x20) == 0) {
            uVar8 = uVar5 | 0x20;
            x86_stl_phys_notdirty_x86_64(cs,uVar9,(uint)uVar5 | 0x20);
          }
          local_40 = (uVar4 & 0x8000000000000006 ^ 0x8000000000000000) &
                     (uVar5 ^ 0x8000000000000000);
          iVar3 = 0x40000000;
          if ((char)uVar8 < '\0') goto LAB_00508028;
          goto LAB_00507f31;
        }
        goto LAB_005080ab;
      }
    }
LAB_005080b2:
    local_48 = 4;
LAB_005080c2:
    x86_stq_phys_x86_64(cs,(hwaddr)(cs[1].tb_jmp_cache[0x397]->jmp_list_next + 1),gphys);
    if (access_type == MMU_DATA_STORE) goto LAB_00508129;
    if (access_type != MMU_INST_FETCH) goto LAB_00508132;
LAB_00508103:
    uVar6 = 0x10;
  }
  local_48 = local_48 | uVar6;
LAB_00508132:
  cpu_vmexit_x86_64((CPUX86State *)(cs[1].tb_jmp_cache + 0xeb),0x400,
                    ((ulong)(prot == (int *)0x0) << 0x20) + local_48 + 0x100000000,
                    (uintptr_t)cs[1].tb_jmp_cache[0x39e]);
}

Assistant:

static hwaddr get_hphys(CPUState *cs, hwaddr gphys, MMUAccessType access_type,
                        int *prot)
{
    CPUX86State *env = &X86_CPU(cs)->env;
    uint64_t rsvd_mask = PG_HI_RSVD_MASK;
    uint64_t ptep, pte;
    uint64_t exit_info_1 = 0;
    target_ulong pde_addr, pte_addr;
    uint32_t page_offset;
    int page_size;

    if (likely(!(env->hflags2 & HF2_NPT_MASK))) {
        return gphys;
    }

    if (!(env->nested_pg_mode & SVM_NPT_NXE)) {
        rsvd_mask |= PG_NX_MASK;
    }

    if (env->nested_pg_mode & SVM_NPT_PAE) {
        uint64_t pde, pdpe;
        target_ulong pdpe_addr;

#ifdef TARGET_X86_64
        if (env->nested_pg_mode & SVM_NPT_LMA) {
            uint64_t pml5e;
            uint64_t pml4e_addr, pml4e;

            pml5e = env->nested_cr3;
            ptep = PG_NX_MASK | PG_USER_MASK | PG_RW_MASK;

            pml4e_addr = (pml5e & PG_ADDRESS_MASK) +
                    (((gphys >> 39) & 0x1ff) << 3);
            pml4e = x86_ldq_phys(cs, pml4e_addr);
            if (!(pml4e & PG_PRESENT_MASK)) {
                goto do_fault;
            }
            if (pml4e & (rsvd_mask | PG_PSE_MASK)) {
                goto do_fault_rsvd;
            }
            if (!(pml4e & PG_ACCESSED_MASK)) {
                pml4e |= PG_ACCESSED_MASK;
                x86_stl_phys_notdirty(cs, pml4e_addr, pml4e);
            }
            ptep &= pml4e ^ PG_NX_MASK;
            pdpe_addr = (pml4e & PG_ADDRESS_MASK) +
                    (((gphys >> 30) & 0x1ff) << 3);
            pdpe = x86_ldq_phys(cs, pdpe_addr);
            if (!(pdpe & PG_PRESENT_MASK)) {
                goto do_fault;
            }
            if (pdpe & rsvd_mask) {
                goto do_fault_rsvd;
            }
            ptep &= pdpe ^ PG_NX_MASK;
            if (!(pdpe & PG_ACCESSED_MASK)) {
                pdpe |= PG_ACCESSED_MASK;
                x86_stl_phys_notdirty(cs, pdpe_addr, pdpe);
            }
            if (pdpe & PG_PSE_MASK) {
                /* 1 GB page */
                page_size = 1024 * 1024 * 1024;
                pte_addr = pdpe_addr;
                pte = pdpe;
                goto do_check_protect;
            }
        } else
#endif
        {
            pdpe_addr = (env->nested_cr3 & ~0x1f) + ((gphys >> 27) & 0x18);
            pdpe = x86_ldq_phys(cs, pdpe_addr);
            if (!(pdpe & PG_PRESENT_MASK)) {
                goto do_fault;
            }
            rsvd_mask |= PG_HI_USER_MASK;
            if (pdpe & (rsvd_mask | PG_NX_MASK)) {
                goto do_fault_rsvd;
            }
            ptep = PG_NX_MASK | PG_USER_MASK | PG_RW_MASK;
        }

        pde_addr = (pdpe & PG_ADDRESS_MASK) + (((gphys >> 21) & 0x1ff) << 3);
        pde = x86_ldq_phys(cs, pde_addr);
        if (!(pde & PG_PRESENT_MASK)) {
            goto do_fault;
        }
        if (pde & rsvd_mask) {
            goto do_fault_rsvd;
        }
        ptep &= pde ^ PG_NX_MASK;
        if (pde & PG_PSE_MASK) {
            /* 2 MB page */
            page_size = 2048 * 1024;
            pte_addr = pde_addr;
            pte = pde;
            goto do_check_protect;
        }
        /* 4 KB page */
        if (!(pde & PG_ACCESSED_MASK)) {
            pde |= PG_ACCESSED_MASK;
            x86_stl_phys_notdirty(cs, pde_addr, pde);
        }
        pte_addr = (pde & PG_ADDRESS_MASK) + (((gphys >> 12) & 0x1ff) << 3);
        pte = x86_ldq_phys(cs, pte_addr);
        if (!(pte & PG_PRESENT_MASK)) {
            goto do_fault;
        }
        if (pte & rsvd_mask) {
            goto do_fault_rsvd;
        }
        /* combine pde and pte nx, user and rw protections */
        ptep &= pte ^ PG_NX_MASK;
        page_size = 4096;
    } else {
        uint32_t pde;

        /* page directory entry */
        pde_addr = (env->nested_cr3 & ~0xfff) + ((gphys >> 20) & 0xffc);
        pde = x86_ldl_phys(cs, pde_addr);
        if (!(pde & PG_PRESENT_MASK)) {
            goto do_fault;
        }
        ptep = pde | PG_NX_MASK;

        /* if PSE bit is set, then we use a 4MB page */
        if ((pde & PG_PSE_MASK) && (env->cr[4] & CR4_PSE_MASK)) {
            page_size = 4096 * 1024;
            pte_addr = pde_addr;

            /* Bits 20-13 provide bits 39-32 of the address, bit 21 is reserved.
             * Leave bits 20-13 in place for setting accessed/dirty bits below.
             */
            pte = pde | ((pde & 0x1fe000LL) << (32 - 13));
            rsvd_mask = 0x200000;
            goto do_check_protect_pse36;
        }

        if (!(pde & PG_ACCESSED_MASK)) {
            pde |= PG_ACCESSED_MASK;
            x86_stl_phys_notdirty(cs, pde_addr, pde);
        }

        /* page directory entry */
        pte_addr = (pde & ~0xfff) + ((gphys >> 10) & 0xffc);
        pte = x86_ldl_phys(cs, pte_addr);
        if (!(pte & PG_PRESENT_MASK)) {
            goto do_fault;
        }
        /* combine pde and pte user and rw protections */
        ptep &= pte | PG_NX_MASK;
        page_size = 4096;
        rsvd_mask = 0;
    }

 do_check_protect:
    rsvd_mask |= (page_size - 1) & PG_ADDRESS_MASK & ~PG_PSE_PAT_MASK;
 do_check_protect_pse36:
    if (pte & rsvd_mask) {
        goto do_fault_rsvd;
    }
    ptep ^= PG_NX_MASK;

    if (!(ptep & PG_USER_MASK)) {
        goto do_fault_protect;
    }
    if (ptep & PG_NX_MASK) {
        if (access_type == MMU_INST_FETCH) {
            goto do_fault_protect;
        }
        *prot &= ~PAGE_EXEC;
    }
    if (!(ptep & PG_RW_MASK)) {
        if (access_type == MMU_DATA_STORE) {
            goto do_fault_protect;
        }
        *prot &= ~PAGE_WRITE;
    }

    pte &= PG_ADDRESS_MASK & ~(page_size - 1);
    page_offset = gphys & (page_size - 1);
    return pte + page_offset;

 do_fault_rsvd:
    exit_info_1 |= SVM_NPTEXIT_RSVD;
 do_fault_protect:
    exit_info_1 |= SVM_NPTEXIT_P;
 do_fault:
    x86_stq_phys(cs, env->vm_vmcb + offsetof(struct vmcb, control.exit_info_2),
                 gphys);
    exit_info_1 |= SVM_NPTEXIT_US;
    if (access_type == MMU_DATA_STORE) {
        exit_info_1 |= SVM_NPTEXIT_RW;
    } else if (access_type == MMU_INST_FETCH) {
        exit_info_1 |= SVM_NPTEXIT_ID;
    }
    if (prot) {
        exit_info_1 |= SVM_NPTEXIT_GPA;
    } else { /* page table access */
        exit_info_1 |= SVM_NPTEXIT_GPT;
    }
    cpu_vmexit(env, SVM_EXIT_NPF, exit_info_1, env->retaddr);
}